

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::renderPixel(embree *this,TutorialData *data,float x,float y,ISPCCamera *camera,
                   RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ISPCType IVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar19;
  float fVar21;
  undefined1 auVar11 [16];
  float fVar20;
  float fVar23;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar22;
  undefined1 auVar18 [16];
  float fVar24;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  float fVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  float fVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar52;
  vfloat4 a_1;
  float fVar53;
  float fVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vfloat4 a;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  vfloat4 a0_1;
  float fVar69;
  float fVar70;
  Vec3fa VVar71;
  Vec3fa transparency;
  RayQueryContext context;
  float local_2a8;
  undefined8 local_298;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  undefined4 uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  undefined4 local_174;
  uint uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_120;
  undefined8 *local_118;
  TutorialData *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  code *local_f8;
  undefined8 local_f0;
  float local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  undefined4 local_94;
  undefined8 local_74;
  undefined8 local_6c;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar39 [16];
  undefined1 auVar64 [16];
  
  uVar7 = (int)y << 0x10 | (int)x;
  uVar7 = uVar7 * -0x3361d2af >> 0x11 | uVar7 * 0x16a88000;
  uVar7 = (data->accu_count * -0x3361d2af >> 0x11 | data->accu_count * 0x16a88000) * 0x1b873593 ^
          (uVar7 * -0x194da000 | uVar7 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar7 = (uVar7 << 0xd | uVar7 >> 0x13) * 5 + 0xe6546b64;
  uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
  uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
  uVar7 = uVar7 >> 0x10 ^ uVar7;
  local_48 = &local_120;
  local_120 = 0xffffffffffffffff;
  local_118 = (undefined8 *)0x0;
  local_50 = 0x100004200000000;
  local_278 = 0.0;
  fStack_274 = 0.0;
  fStack_270 = 0.0;
  fStack_26c = 0.0;
  local_40 = 0;
  uStack_38 = 0;
  uVar8 = uVar7 * -0x50b6f56b + 0xd1ccf6e9;
  fVar9 = x + (float)(uVar7 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
  fVar19 = y + (float)(uVar7 * 0x17385ca9 + 0x47502932 >> 1) * 4.656613e-10;
  local_e8 = (float)(uVar8 >> 1) * 4.656613e-10;
  auVar55._4_4_ = (camera->xfm).l.vy.field_0.field_0.x * fVar19;
  fVar24 = auVar55._4_4_ + (camera->xfm).l.vx.field_0.field_0.x * fVar9 +
           (camera->xfm).l.vz.field_0.field_0.x;
  uVar22 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar46 = (float)uVar2 + fVar19 * (float)uVar1 + fVar9 * (float)uVar22;
  fVar9 = (float)((ulong)uVar2 >> 0x20) +
          fVar19 * (float)((ulong)uVar1 >> 0x20) + fVar9 * (float)((ulong)uVar22 >> 0x20);
  auVar56._4_4_ = auVar55._4_4_;
  auVar56._0_4_ = fVar24;
  auVar56._8_4_ = auVar55._4_4_;
  auVar56._12_4_ = auVar55._4_4_;
  auVar11._4_12_ = auVar56._4_12_;
  auVar11._0_4_ = fVar24 * fVar24 + fVar46 * fVar46 + fVar9 * fVar9;
  auVar55._0_4_ = auVar11._0_4_;
  auVar55._8_4_ = auVar55._4_4_;
  auVar55._12_4_ = auVar55._4_4_;
  auVar56 = rsqrtss(auVar55,auVar11);
  fVar19 = auVar56._0_4_;
  fVar19 = fVar19 * fVar19 * auVar11._0_4_ * -0.5 * fVar19 + fVar19 * 1.5;
  fStack_1b0 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_1b8 = (undefined1  [8])*(undefined8 *)&(camera->xfm).p.field_0;
  uStack_1ac = 0;
  fStack_19c = 0.0;
  uStack_16c = 0xffffffff;
  uStack_168 = 0xffffffff;
  uStack_210 = 0x3f8000003f800000;
  local_218 = (undefined1  [8])0x3f8000003f800000;
  uVar7 = 0;
  local_1a8 = fVar24 * fVar19;
  fStack_1a4 = fVar19 * fVar46;
  fStack_1a0 = fVar19 * fVar9;
  local_110 = data;
  local_d8 = local_e8;
  fStack_d4 = local_e8;
  fStack_d0 = local_e8;
  fStack_cc = local_e8;
  do {
    uStack_170 = 0xffffffff;
    local_174 = 0xffffffff;
    local_198 = 0xffffffff7f800000;
    rtcTraversableIntersect1(data->traversable,local_1b8,&local_50);
    stats->numRays = stats->numRays + 1;
    if ((ulong)uStack_170 == 0xffffffff) {
      fVar9 = (float)local_218._0_4_ * (data->ambient_intensity).field_0.m128[0];
      fVar19 = (float)local_218._4_4_ * (data->ambient_intensity).field_0.m128[1];
      uVar22 = CONCAT44(fVar19,fVar9);
      auVar18._0_4_ = local_278 + fVar9;
      auVar18._4_4_ = fStack_274 + fVar19;
      auVar18._8_4_ = fStack_270 + (float)uStack_210 * (data->ambient_intensity).field_0.m128[2];
      auVar18._12_4_ = fStack_26c + uStack_210._4_4_ * (data->ambient_intensity).field_0.m128[3];
      goto LAB_00120650;
    }
    IVar3 = data->ispc_scene->geometries[uStack_170]->type;
    if (IVar3 == TRIANGLE_MESH) {
      auVar36._4_4_ = fStack_184;
      auVar36._0_4_ = local_188;
      auVar36._8_8_ = 0;
      if (0.0 < fStack_180 * fStack_1a0 + fStack_184 * fStack_1a4 + local_188 * local_1a8) {
        auVar36._0_8_ = CONCAT44(fStack_184,local_188) ^ 0x8000000080000000;
        auVar36._8_4_ = 0x80000000;
        auVar36._12_4_ = 0x80000000;
        fStack_180 = -fStack_180;
        local_188 = -local_188;
        fStack_184 = -fStack_184;
      }
      fVar19 = auVar36._0_4_;
      fVar24 = auVar36._4_4_;
      auVar49._0_4_ = fVar19 * fVar19 + fVar24 * fVar24 + fStack_180 * fStack_180;
      auVar49._4_12_ = auVar36._4_12_;
      auVar58._4_4_ = fVar24;
      auVar58._0_4_ = auVar49._0_4_;
      auVar58._8_4_ = auVar36._8_4_;
      auVar58._12_4_ = auVar36._12_4_;
      auVar56 = rsqrtss(auVar58,auVar49);
      fVar9 = auVar56._0_4_;
      fVar62 = fVar9 * 1.5 - fVar9 * fVar9 * auVar49._0_4_ * 0.5 * fVar9;
      fVar9 = fStack_180 * fVar62;
      fVar19 = fVar62 * fVar19;
      fVar62 = fVar62 * fVar24;
      fStack_1c0 = fStack_1a4 * fVar19 - local_1a8 * fVar62;
      local_1c8._0_4_ = fStack_1a0 * fVar62 - fStack_1a4 * fVar9;
      local_1c8._4_4_ = local_1a8 * fVar9 - fStack_1a0 * fVar19;
      fVar52 = fStack_19c * 0.0 - fStack_19c * 0.0;
      fVar24 = (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
      fVar46 = (float)local_1c8._4_4_ * (float)local_1c8._4_4_;
      fVar53 = fVar52 * fVar52;
      fVar54 = fVar46 + fVar24 + fStack_1c0 * fStack_1c0;
      auVar65._0_8_ = CONCAT44(fVar53 + fVar24 + fVar24,fVar54);
      auVar65._8_4_ = fVar46 + fVar24 + fVar46;
      auVar65._12_4_ = fVar53 + fVar24 + fVar53;
      auVar37._8_4_ = auVar65._8_4_;
      auVar37._0_8_ = auVar65._0_8_;
      auVar37._12_4_ = auVar65._12_4_;
      auVar56 = rsqrtss(auVar37,auVar65);
      fVar24 = auVar56._0_4_;
      fStack_1bc = fVar24 * 1.5 - fVar24 * fVar24 * fVar54 * 0.5 * fVar24;
      local_1c8._0_4_ = fStack_1bc * (float)local_1c8._0_4_;
      local_1c8._4_4_ = fStack_1bc * (float)local_1c8._4_4_;
      fStack_1c0 = fStack_1bc * fStack_1c0;
      fStack_1bc = fStack_1bc * fVar52;
      local_258._4_4_ = fVar62;
      local_258._0_4_ = fVar19;
      fStack_250 = fVar9;
      fStack_24c = 0.0;
      fStack_1d0 = (float)local_1c8._4_4_ * fVar19 - fVar62 * (float)local_1c8._0_4_;
      local_1d8 = fStack_1c0 * fVar62 - fVar9 * (float)local_1c8._4_4_;
      fStack_1d4 = (float)local_1c8._0_4_ * fVar9 - fVar19 * fStack_1c0;
      fVar24 = fStack_1bc * 0.0 - fStack_1bc * 0.0;
      fVar9 = local_1d8 * local_1d8;
      fVar19 = fStack_1d4 * fStack_1d4;
      fVar46 = fVar24 * fVar24;
      fVar52 = fVar19 + fVar9 + fStack_1d0 * fStack_1d0;
      auVar59._0_8_ = CONCAT44(fVar46 + fVar9 + fVar9,fVar52);
      auVar59._8_4_ = fVar19 + fVar9 + fVar19;
      auVar59._12_4_ = fVar46 + fVar9 + fVar46;
      auVar38._8_4_ = auVar59._8_4_;
      auVar38._0_8_ = auVar59._0_8_;
      auVar38._12_4_ = auVar59._12_4_;
      auVar56 = rsqrtss(auVar38,auVar59);
      fVar9 = auVar56._0_4_;
      fStack_1cc = fVar9 * 1.5 - fVar9 * fVar9 * fVar52 * 0.5 * fVar9;
      local_1d8 = fStack_1cc * local_1d8;
      fStack_1d4 = fStack_1cc * fStack_1d4;
      fStack_1d0 = fStack_1cc * fStack_1d0;
      fStack_1cc = fStack_1cc * fVar24;
      local_1e8 = 0.0;
      fStack_1e4 = 0.0;
      fStack_1e0 = 0.0;
      fStack_1dc = 0.0;
      local_158._0_12_ = ZEXT812(0x3ea2f983);
      auVar25 = ZEXT812(0x3ef47644);
      local_148._0_12_ = ZEXT812(0x3f800000);
      local_148._12_4_ = 0;
      uStack_260 = 0x3f8000003f800000;
      local_268 = (undefined1  [8])0x3f8000003f800000;
      local_298 = 0x3f8000003f800000;
    }
    else {
      uVar22 = extraout_XMM1_Qa;
      if (IVar3 != CURVES) {
LAB_0012062a:
        auVar18._4_4_ = fStack_274;
        auVar18._0_4_ = local_278;
        auVar18._8_4_ = fStack_270;
        auVar18._12_4_ = fStack_26c;
LAB_00120650:
        *(undefined1 (*) [16])this = auVar18;
        VVar71.field_0._0_8_ = auVar18._0_8_;
        VVar71.field_0._8_8_ = uVar22;
        return (Vec3fa)VVar71.field_0;
      }
      fVar19 = local_188 * local_188 + fStack_184 * fStack_184 + fStack_180 * fStack_180;
      auVar56 = rsqrtss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
      fVar9 = auVar56._0_4_;
      fVar19 = fVar9 * 1.5 - fVar9 * fVar9 * fVar19 * 0.5 * fVar9;
      fVar9 = local_188 * fVar19;
      fVar24 = fVar19 * fStack_184;
      fVar19 = fVar19 * fStack_180;
      fStack_1d0 = local_1a8 * fVar24 - fStack_1a4 * fVar9;
      local_1d8 = fStack_1a4 * fVar19 - fStack_1a0 * fVar24;
      fStack_1d4 = fStack_1a0 * fVar9 - local_1a8 * fVar19;
      fVar53 = fStack_19c * 0.0 - fStack_19c * 0.0;
      fVar46 = local_1d8 * local_1d8;
      fVar52 = fStack_1d4 * fStack_1d4;
      fVar54 = fVar53 * fVar53;
      fVar62 = fVar52 + fVar46 + fStack_1d0 * fStack_1d0;
      auVar64._0_8_ = CONCAT44(fVar54 + fVar46 + fVar46,fVar62);
      auVar64._8_4_ = fVar52 + fVar46 + fVar52;
      auVar64._12_4_ = fVar54 + fVar46 + fVar54;
      auVar48._8_4_ = auVar64._8_4_;
      auVar48._0_8_ = auVar64._0_8_;
      auVar48._12_4_ = auVar64._12_4_;
      auVar56 = rsqrtss(auVar48,auVar64);
      fVar46 = auVar56._0_4_;
      fStack_1cc = fVar46 * 1.5 - fVar46 * fVar46 * fVar62 * 0.5 * fVar46;
      local_1d8 = fStack_1cc * local_1d8;
      fStack_1d4 = fStack_1cc * fStack_1d4;
      fStack_1d0 = fStack_1cc * fStack_1d0;
      fStack_1cc = fStack_1cc * fVar53;
      local_1c8._4_4_ = fVar24;
      local_1c8._0_4_ = fVar9;
      fStack_1c0 = fVar19;
      fStack_1bc = 0.0;
      fVar46 = fVar24 * local_1d8 - fStack_1d4 * fVar9;
      fVar24 = fVar19 * fStack_1d4 - fStack_1d0 * fVar24;
      fVar19 = fVar9 * fStack_1d0 - local_1d8 * fVar19;
      fVar53 = fStack_1cc * 0.0 - fStack_1cc * 0.0;
      fVar9 = fVar24 * fVar24;
      fVar52 = fVar19 * fVar19;
      fVar54 = fVar53 * fVar53;
      fVar62 = fVar52 + fVar9 + fVar46 * fVar46;
      auVar57._0_8_ = CONCAT44(fVar54 + fVar9 + fVar9,fVar62);
      auVar57._8_4_ = fVar52 + fVar9 + fVar52;
      auVar57._12_4_ = fVar54 + fVar9 + fVar54;
      auVar26._8_4_ = auVar57._8_4_;
      auVar26._0_8_ = auVar57._0_8_;
      auVar26._12_4_ = auVar57._12_4_;
      auVar56 = rsqrtss(auVar26,auVar57);
      fVar9 = auVar56._0_4_;
      fVar9 = fVar9 * 1.5 - fVar9 * fVar9 * fVar62 * 0.5 * fVar9;
      local_258._4_4_ = fVar9 * fVar19;
      local_258._0_4_ = fVar9 * fVar24;
      fStack_250 = fVar9 * fVar46;
      fStack_24c = fVar9 * fVar53;
      local_1e8 = (data->hair_Kt).field_0.m128[0];
      fStack_1e4 = (data->hair_Kt).field_0.m128[1];
      fStack_1e0 = (data->hair_Kt).field_0.m128[2];
      fStack_1dc = (data->hair_Kt).field_0.m128[3];
      fVar19 = (data->hair_Kr).field_0.m128[1];
      fVar9 = (data->hair_Kr).field_0.m128[0];
      if (fVar19 <= fVar9) {
        fVar19 = fVar9;
      }
      fVar9 = (data->hair_Kr).field_0.m128[2];
      if (fVar9 <= fVar19) {
        fVar9 = fVar19;
      }
      fVar19 = fStack_1e4;
      if (fStack_1e4 <= local_1e8) {
        fVar19 = local_1e8;
      }
      fVar24 = fStack_1e0;
      if (fStack_1e0 <= fVar19) {
        fVar24 = fVar19;
      }
      local_148 = ZEXT416((uint)(fVar9 / (fVar24 + fVar9)));
      _local_268 = *(undefined1 (*) [16])(data->hair_Kr).field_0.m128;
      local_158._0_12_ = ZEXT812(0x3fa1b247);
      auVar25 = ZEXT812(0x3fbf1acf);
      local_298 = 0x4000000041a00000;
    }
    local_158._12_4_ = 0;
    local_2a8 = auVar25._0_4_;
    local_b8 = (float)local_198 * local_1a8 + (float)local_1b8._0_4_;
    fStack_b4 = (float)local_198 * fStack_1a4 + (float)local_1b8._4_4_;
    fStack_b0 = (float)local_198 * fStack_1a0 + fStack_1b0;
    local_a8 = -(data->dirlight_direction).field_0.m128[0];
    fStack_a4 = -(data->dirlight_direction).field_0.m128[1];
    fStack_a0 = -(data->dirlight_direction).field_0.m128[2];
    uStack_ac = 0x38d1b717;
    fStack_9c = fStack_cc;
    local_98 = INFINITY;
    local_6c = 0xffffffffffffffff;
    local_138 = 0x3f8000003f800000;
    uStack_130 = 0x3f8000003f800000;
    local_118 = &local_138;
    local_74 = 0xffffffffffffffff;
    local_94 = 0xffffffff;
    local_108 = 0x100004200000000;
    local_f0 = 0;
    local_100 = &local_120;
    local_f8 = occlusionFilter;
    rtcTraversableOccluded1(data->traversable,&local_b8,&local_108);
    local_118 = (undefined8 *)0x0;
    fVar9 = 0.0;
    fVar19 = 0.0;
    fVar24 = 0.0;
    fVar46 = 0.0;
    if (0.0 <= local_98) {
      fVar9 = (float)local_138;
      fVar19 = local_138._4_4_;
      fVar24 = (float)uStack_130;
      fVar46 = uStack_130._4_4_;
    }
    stats->numRays = stats->numRays + 1;
    fVar52 = -(data->dirlight_direction).field_0.m128[0];
    fVar53 = -(data->dirlight_direction).field_0.m128[1];
    fVar54 = -(data->dirlight_direction).field_0.m128[2];
    fVar62 = -(data->dirlight_direction).field_0.m128[3];
    fVar69 = (float)local_258._4_4_ * fVar53 + (float)local_258._0_4_ * fVar52 + fStack_250 * fVar54
    ;
    if (fVar69 <= 0.0) {
      fVar23 = fVar69 + fVar69;
      fVar20 = (fVar23 * (float)local_258._0_4_ - fVar52) + -local_1a8;
      fVar53 = (fVar23 * (float)local_258._4_4_ - fVar53) + -fStack_1a4;
      fVar21 = (fVar23 * fStack_250 - fVar54) + -fStack_1a0;
      fVar44 = (fVar23 * fStack_24c - fVar62) + -fStack_19c;
      fVar52 = fVar53 * fVar53;
      fVar54 = fVar21 * fVar21;
      fVar62 = fVar44 * fVar44;
      fVar23 = fVar52 + fVar20 * fVar20 + fVar54;
      auVar27._0_8_ = CONCAT44(fVar52 + fVar52 + fVar62,fVar23);
      auVar27._8_4_ = fVar52 + fVar54 + fVar54;
      auVar27._12_4_ = fVar52 + fVar62 + fVar62;
      auVar13._8_4_ = auVar27._8_4_;
      auVar13._0_8_ = auVar27._0_8_;
      auVar13._12_4_ = auVar27._12_4_;
      auVar56 = rsqrtss(auVar13,auVar27);
      fVar52 = auVar56._0_4_;
      fVar52 = fVar52 * fVar52 * fVar23 * -0.5 * fVar52 + fVar52 * 1.5;
      fVar20 = fVar52 * fVar20;
      fVar53 = fVar52 * fVar53;
      fVar21 = fVar52 * fVar21;
      fVar54 = (float)local_1c8._4_4_ * fVar53;
      fVar62 = fStack_1c0 * fVar21;
      fVar34 = fStack_1bc * fVar52 * fVar44;
      fVar33 = fVar54 + (float)local_1c8._0_4_ * fVar20 + fVar62;
      fVar35 = fVar54 + fVar54 + fVar34;
      fVar62 = fVar54 + fVar62 + fVar62;
      fVar34 = fVar54 + fVar34 + fVar34;
      fVar54 = fStack_1d4 * fVar53;
      fVar23 = fStack_1d0 * fVar21;
      fStack_1cc = fStack_1cc * fVar52 * fVar44;
      fVar52 = fVar54 + local_1d8 * fVar20 + fVar23;
      fVar44 = fVar54 + fVar54 + fStack_1cc;
      fVar23 = fVar54 + fVar23 + fVar23;
      fStack_1cc = fVar54 + fStack_1cc + fStack_1cc;
      fVar33 = fVar33 * fVar33;
      fVar52 = fVar52 * fVar52;
      auVar61._0_4_ = fVar33 + fVar52;
      auVar61._4_4_ = fVar35 * fVar35 + fVar44 * fVar44;
      auVar61._8_4_ = fVar62 * fVar62 + fVar23 * fVar23;
      auVar61._12_4_ = fVar34 * fVar34 + fStack_1cc * fStack_1cc;
      if ((auVar61._0_4_ != 0.0) || (fVar62 = local_2a8, NAN(auVar61._0_4_))) {
        auVar51._4_4_ = auVar61._4_4_;
        auVar51._0_4_ = auVar61._0_4_;
        auVar51._8_4_ = auVar61._8_4_;
        auVar51._12_4_ = auVar61._12_4_;
        auVar56 = rcpss(auVar51,auVar61);
        fVar62 = powf(ABS(fVar21 * fStack_250 +
                          fVar53 * (float)local_258._4_4_ + fVar20 * (float)local_258._0_4_),
                      (2.0 - auVar61._0_4_ * auVar56._0_4_) * auVar56._0_4_ *
                      (fVar33 * (float)local_298 + fVar52 * local_298._4_4_));
        fVar62 = fVar62 * local_2a8;
      }
      fVar52 = fVar62 * local_1e8;
      fVar53 = fVar62 * fStack_1e4;
      fVar54 = fVar62 * fStack_1e0;
      fVar62 = fVar62 * fStack_1dc;
      fVar69 = ABS(fVar69);
    }
    else {
      fVar52 = -local_1a8 + fVar52;
      fVar53 = -fStack_1a4 + fVar53;
      fVar54 = -fStack_1a0 + fVar54;
      fVar62 = -fStack_19c + fVar62;
      fVar20 = fVar53 * fVar53;
      fVar21 = fVar54 * fVar54;
      fVar23 = fVar62 * fVar62;
      fVar34 = fVar20 + fVar52 * fVar52 + fVar21;
      auVar39._0_8_ = CONCAT44(fVar20 + fVar20 + fVar23,fVar34);
      auVar39._8_4_ = fVar20 + fVar21 + fVar21;
      auVar39._12_4_ = fVar20 + fVar23 + fVar23;
      auVar12._8_4_ = auVar39._8_4_;
      auVar12._0_8_ = auVar39._0_8_;
      auVar12._12_4_ = auVar39._12_4_;
      auVar56 = rsqrtss(auVar12,auVar39);
      fVar20 = auVar56._0_4_;
      fVar20 = fVar20 * fVar20 * fVar34 * -0.5 * fVar20 + fVar20 * 1.5;
      fVar52 = fVar20 * fVar52;
      fVar53 = fVar20 * fVar53;
      fVar54 = fVar20 * fVar54;
      fVar21 = (float)local_1c8._4_4_ * fVar53;
      fVar23 = fStack_1c0 * fVar54;
      fVar33 = fStack_1bc * fVar20 * fVar62;
      fVar35 = fVar21 + (float)local_1c8._0_4_ * fVar52 + fVar23;
      fVar44 = fVar21 + fVar21 + fVar33;
      fVar23 = fVar21 + fVar23 + fVar23;
      fVar33 = fVar21 + fVar33 + fVar33;
      fVar21 = fStack_1d4 * fVar53;
      fVar34 = fStack_1d0 * fVar54;
      fStack_1cc = fStack_1cc * fVar20 * fVar62;
      fVar20 = fVar21 + local_1d8 * fVar52 + fVar34;
      fVar62 = fVar21 + fVar21 + fStack_1cc;
      fVar34 = fVar21 + fVar34 + fVar34;
      fStack_1cc = fVar21 + fStack_1cc + fStack_1cc;
      fVar35 = fVar35 * fVar35;
      fVar20 = fVar20 * fVar20;
      auVar60._0_4_ = fVar35 + fVar20;
      auVar60._4_4_ = fVar44 * fVar44 + fVar62 * fVar62;
      auVar60._8_4_ = fVar23 * fVar23 + fVar34 * fVar34;
      auVar60._12_4_ = fVar33 * fVar33 + fStack_1cc * fStack_1cc;
      if ((auVar60._0_4_ != 0.0) || (fVar62 = local_2a8, NAN(auVar60._0_4_))) {
        auVar50._4_4_ = auVar60._4_4_;
        auVar50._0_4_ = auVar60._0_4_;
        auVar50._8_4_ = auVar60._8_4_;
        auVar50._12_4_ = auVar60._12_4_;
        auVar56 = rcpss(auVar50,auVar60);
        fVar62 = powf(ABS(fVar54 * fStack_250 +
                          fVar53 * (float)local_258._4_4_ + fVar52 * (float)local_258._0_4_),
                      (2.0 - auVar60._0_4_ * auVar56._0_4_) * auVar56._0_4_ *
                      (fVar35 * (float)local_298 + fVar20 * local_298._4_4_));
        fVar62 = fVar62 * local_2a8;
      }
      fVar52 = fVar62 * (float)local_268._0_4_;
      fVar53 = fVar62 * (float)local_268._4_4_;
      fVar54 = fVar62 * (float)uStack_260;
      fVar62 = fVar62 * uStack_260._4_4_;
    }
    iVar5 = uVar8 * 0x19660d;
    fVar21 = (data->dirlight_intensity).field_0.m128[0];
    fVar23 = (data->dirlight_intensity).field_0.m128[1];
    fVar34 = (data->dirlight_intensity).field_0.m128[2];
    fVar33 = (data->dirlight_intensity).field_0.m128[3];
    iVar6 = uVar8 * 0x17385ca9;
    uVar8 = uVar8 * -0x50b6f56b + 0xd1ccf6e9;
    local_c8 = -local_1a8;
    fStack_c4 = -fStack_1a4;
    fStack_c0 = -fStack_1a0;
    fStack_bc = -fStack_19c;
    fVar20 = (float)(iVar5 + 0x3c6ef35fU >> 1) * 4.656613e-10 * 6.2831855;
    auVar28._0_4_ = (float)local_298 + 1.0;
    auVar28._4_4_ = local_298._4_4_ + 1.0;
    auVar28._8_8_ = 0;
    auVar56 = auVar28;
    fVar10 = sinf(fVar20);
    fVar20 = cosf(fVar20);
    auVar56 = sqrtps(auVar56,auVar28);
    fVar10 = fVar10 * auVar56._0_4_;
    auVar40._4_4_ = fVar20 * auVar56._4_4_;
    fVar44 = extraout_XMM0_Db * auVar56._8_4_;
    fVar45 = extraout_XMM0_Db_00 * auVar56._12_4_;
    fVar20 = auVar40._4_4_ * auVar40._4_4_;
    fVar35 = fVar20 + fVar10 * fVar10;
    auVar29._0_8_ = CONCAT44(fVar20 + fVar20,fVar35);
    auVar29._8_4_ = fVar20 + fVar44 * fVar44;
    auVar29._12_4_ = fVar20 + fVar45 * fVar45;
    auVar14._8_4_ = auVar29._8_4_;
    auVar14._0_8_ = auVar29._0_8_;
    auVar14._12_4_ = auVar29._12_4_;
    auVar56 = rsqrtss(auVar14,auVar29);
    fVar20 = auVar56._0_4_;
    fVar35 = fVar20 * fVar20 * fVar35 * -0.5 * fVar20 + fVar20 * 1.5;
    fVar10 = fVar10 * fVar35;
    fVar35 = auVar40._4_4_ * fVar35;
    fVar45 = fVar35 * fVar35 * (float)local_298 + fVar10 * fVar10 * local_298._4_4_;
    auVar15._4_4_ = auVar40._4_4_;
    auVar15._0_4_ = fVar45;
    auVar15._8_4_ = auVar40._4_4_;
    auVar15._12_4_ = auVar40._4_4_;
    auVar16._4_12_ = auVar15._4_12_;
    auVar16._0_4_ = fVar45 + 1.0;
    auVar40._0_4_ = auVar16._0_4_;
    auVar40._8_4_ = auVar40._4_4_;
    auVar40._12_4_ = auVar40._4_4_;
    auVar56 = rcpss(auVar40,auVar16);
    fVar44 = powf((float)(iVar6 + 0x47502932U >> 1) * 4.656613e-10,
                  (2.0 - auVar16._0_4_ * auVar56._0_4_) * auVar56._0_4_);
    fVar20 = 1.0 - fVar44 * fVar44;
    if (fVar20 <= 0.0) {
      fVar20 = 0.0;
    }
    fVar45 = powf(fVar44,fVar45);
    fVar45 = (float)local_158._0_4_ * fVar45;
    fVar35 = fVar35 * SQRT(fVar20);
    fVar10 = fVar10 * SQRT(fVar20);
    fVar67 = fVar44 * (float)local_258._0_4_ + fVar10 * local_1d8 + fVar35 * (float)local_1c8._0_4_;
    fVar68 = fVar44 * (float)local_258._4_4_ + fVar10 * fStack_1d4 + fVar35 * (float)local_1c8._4_4_
    ;
    fVar10 = fVar44 * fStack_250 + fVar10 * fStack_1d0 + fVar35 * fStack_1c0;
    fVar44 = fVar10 * fStack_c0 + fVar68 * fStack_c4 + fVar67 * local_c8;
    fVar44 = fVar44 + fVar44;
    fVar20 = fVar44 * fVar67 - local_c8;
    fVar35 = fVar44 * fVar68 - fStack_c4;
    fVar44 = fVar44 * fVar10 - fStack_c0;
    if ((float)local_148._0_4_ <= (float)(uVar8 >> 1) * 4.656613e-10) {
      fVar47 = fStack_250 * fVar44 +
               (float)local_258._4_4_ * fVar35 + (float)local_258._0_4_ * fVar20;
      fVar47 = fVar47 + fVar47;
      fVar20 = fVar47 * (float)local_258._0_4_ - fVar20;
      fVar35 = fVar47 * (float)local_258._4_4_ - fVar35;
      fVar44 = fVar47 * fStack_250 - fVar44;
      fVar47 = (1.0 - (float)local_148._0_4_) * fVar45;
      fVar70 = fStack_250 * fVar44 +
               (float)local_258._4_4_ * fVar35 + (float)local_258._0_4_ * fVar20;
      fVar63 = fStack_1c0 * fVar10 +
               (float)local_1c8._4_4_ * fVar68 + (float)local_1c8._0_4_ * fVar67;
      fVar63 = fVar63 * fVar63;
      fVar66 = fStack_1d0 * fVar10 + fStack_1d4 * fVar68 + local_1d8 * fVar67;
      fVar66 = fVar66 * fVar66;
      auVar43._4_4_ = fStack_1bc * fVar45;
      auVar43._0_4_ = fVar63;
      auVar43._8_4_ = fStack_1c0 * fVar10;
      auVar43._12_4_ = fStack_1bc * fVar45;
      auVar42._4_12_ = auVar43._4_12_;
      auVar42._0_4_ = fVar63 + fVar66;
      uVar22 = CONCAT44(fStack_1e4,local_1e8);
      uStack_260._0_4_ = fStack_1e0;
      local_268 = (undefined1  [8])uVar22;
      uStack_260._4_4_ = fStack_1dc;
      fVar45 = auVar42._0_4_;
      if (auVar42._0_4_ == 0.0) goto joined_r0x0012046a;
LAB_00120470:
      auVar56 = rcpss(auVar42,auVar42);
      fVar10 = powf(ABS(fVar10 * fStack_250 +
                        fVar68 * (float)local_258._4_4_ + fVar67 * (float)local_258._0_4_),
                    (2.0 - auVar42._0_4_ * auVar56._0_4_) * auVar56._0_4_ *
                    ((float)local_298 * fVar63 + local_298._4_4_ * fVar66));
      local_2a8 = local_2a8 * fVar10;
      auVar25._4_8_ = auVar25._4_8_;
      auVar25._0_4_ = local_2a8;
      uVar22 = auVar25._0_8_;
      local_1e8 = (float)local_268._0_4_;
      fStack_1e4 = (float)local_268._4_4_;
      fStack_1e0 = (float)uStack_260;
      fStack_1dc = uStack_260._4_4_;
    }
    else {
      fVar47 = (float)local_148._0_4_ * fVar45;
      fVar70 = fStack_250 * fVar44 +
               (float)local_258._4_4_ * fVar35 + (float)local_258._0_4_ * fVar20;
      fVar63 = fStack_1c0 * fVar10 +
               (float)local_1c8._4_4_ * fVar68 + (float)local_1c8._0_4_ * fVar67;
      fVar63 = fVar63 * fVar63;
      fVar66 = fStack_1d0 * fVar10 + fStack_1d4 * fVar68 + local_1d8 * fVar67;
      fVar66 = fVar66 * fVar66;
      auVar41._4_4_ = fStack_1bc * fVar45;
      auVar41._0_4_ = fVar63;
      auVar41._8_4_ = fStack_1c0 * fVar10;
      auVar41._12_4_ = fStack_1bc * fVar45;
      auVar42._4_12_ = auVar41._4_12_;
      auVar42._0_4_ = fVar63 + fVar66;
      uVar22 = local_268;
      local_1e8 = (float)local_268._0_4_;
      fStack_1e4 = (float)local_268._4_4_;
      fStack_1e0 = (float)uStack_260;
      fStack_1dc = uStack_260._4_4_;
      fVar45 = auVar42._0_4_;
      if (auVar42._0_4_ != 0.0) goto LAB_00120470;
joined_r0x0012046a:
      if (NAN(fVar45)) goto LAB_00120470;
    }
    local_278 = local_278 + fVar9 * fVar69 * fVar52 * (float)local_218._0_4_ * fVar21;
    fStack_274 = fStack_274 + fVar19 * fVar69 * fVar53 * (float)local_218._4_4_ * fVar23;
    fStack_270 = fStack_270 + fVar24 * fVar69 * fVar54 * (float)uStack_210 * fVar34;
    fStack_26c = fStack_26c + fVar46 * fVar69 * fVar62 * uStack_210._4_4_ * fVar33;
    auVar17._4_4_ = fVar47;
    auVar17._0_4_ = fVar47;
    auVar17._8_4_ = fVar47;
    auVar17._12_4_ = fVar47;
    if (fVar47 <= 0.0) goto LAB_0012062a;
    fVar9 = *(float *)(&DAT_0024accc +
                      (ulong)(fStack_250 * fVar44 +
                              (float)local_258._4_4_ * fVar35 + (float)local_258._0_4_ * fVar20 <
                             0.0) * 4);
    local_1b8._4_4_ =
         fVar9 * (float)local_258._4_4_ + (float)local_198 * fStack_1a4 + (float)local_1b8._4_4_;
    local_1b8._0_4_ =
         fVar9 * (float)local_258._0_4_ + (float)local_198 * local_1a8 + (float)local_1b8._0_4_;
    fStack_1b0 = fVar9 * fStack_250 + (float)local_198 * fStack_1a0 + fStack_1b0;
    uStack_1ac = 0x3a83126f;
    fStack_19c = local_e8;
    auVar30._0_4_ = (float)local_218._0_4_ * local_1e8 * local_2a8 * ABS(fVar70);
    auVar30._4_4_ = (float)local_218._4_4_ * fStack_1e4 * local_2a8 * ABS(fVar70);
    auVar30._8_4_ = (float)uStack_210 * fStack_1e0 * local_2a8 * ABS(fVar70);
    auVar30._12_4_ = uStack_210._4_4_ * fStack_1dc * local_2a8 * ABS(fVar70);
    _local_218 = divps(auVar30,auVar17);
    uVar22 = local_218._8_8_;
    fVar9 = local_218._4_4_;
    if (local_218._4_4_ <= local_218._0_4_) {
      fVar9 = local_218._0_4_;
    }
    auVar31._8_8_ = uVar22;
    auVar31._0_8_ = uVar22;
    if (local_218._8_4_ <= fVar9) {
      auVar32._4_12_ = auVar31._4_12_;
      auVar32._0_4_ = fVar9;
      uVar22 = auVar32._0_8_;
    }
    if (((float)uVar22 < 0.01) ||
       (bVar4 = 0x13 < uVar7, uVar7 = uVar7 + 1, local_1a8 = fVar20, fStack_1a4 = fVar35,
       fStack_1a0 = fVar44, bVar4)) goto LAB_0012062a;
  } while( true );
}

Assistant:

Vec3fa renderPixel(const TutorialData& data, float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, data.accu_count);
  x += RandomSampler_get1D(sampler);
  y += RandomSampler_get1D(sampler);
  float time = RandomSampler_get1D(sampler);

  RayQueryContext context;
  InitIntersectionContext(&context);
  context.tutorialData = (void*) &data;

  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.context = &context.context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  Vec3fa color = Vec3fa(0.0f);
  Vec3fa weight = Vec3fa(1.0f);
  unsigned int depth = 0;

  while (true)
  {
    /* terminate ray path */
    if (reduce_max(weight) < 0.01f || depth > 20)
      return color;

    /* intersect ray with scene and gather all hits */
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
    RayStats_addRay(stats);

    /* exit if we hit environment */
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return color + weight*Vec3fa(data.ambient_intensity);

    /* calculate transmissivity of hair */
    AnisotropicBlinn brdf;
    float eps = 0.0001f;

    ISPCGeometry* geometry = data.ispc_scene->geometries[ray.geomID];
    if (geometry->type == CURVES)
    {
      /* calculate tangent space */
      const Vec3fa dx = normalize(ray.Ng);
      const Vec3fa dy = normalize(cross(ray.dir,dx));
      const Vec3fa dz = normalize(cross(dy,dx));

      /* generate anisotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,data.hair_Kr,data.hair_Kt,dx,20.0f,dy,2.0f,dz);
      brdf.Kr = data.hair_Kr;
    }
    else if (geometry->type == TRIANGLE_MESH)
    {
      if (dot(ray.dir,ray.Ng) > 0) ray.Ng = neg(ray.Ng);

      /* calculate tangent space */
      const Vec3fa dz = normalize(ray.Ng);
      const Vec3fa dx = normalize(cross(dz,ray.dir));
      const Vec3fa dy = normalize(cross(dz,dx));

      /* generate isotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,Vec3fa(1.0f),Vec3fa(0.0f),dx,1.0f,dy,1.0f,dz);
    }
    else
      return color;

    /* sample directional light */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(Vec3fa(data.dirlight_direction)), eps, inf, time);
    Vec3fa T = occluded(data.traversable,&context,shadow);
    RayStats_addShadowRay(stats);
    Vec3fa c = AnisotropicBlinn__eval(&brdf,neg(ray.dir),neg(Vec3fa(data.dirlight_direction)));
    color = color + weight*c*T*Vec3fa(data.dirlight_intensity);

#if 1
    /* sample BRDF */
    Vec3ff wi;
    float ru = RandomSampler_get1D(sampler);
    float rv = RandomSampler_get1D(sampler);
    float rw = RandomSampler_get1D(sampler);
    c = AnisotropicBlinn__sample(&brdf,neg(ray.dir),wi,ru,rv,rw);
    if (wi.w <= 0.0f) return color;

    /* calculate secondary ray and offset it out of the hair */
    float sign = dot(Vec3fa(wi),brdf.dz) < 0.0f ? -1.0f : 1.0f;
    ray.org = Vec3ff(ray.org + ray.tfar*ray.dir + sign*eps*brdf.dz);
    ray.dir = Vec3ff(wi);
    ray.tnear() = 0.001f;
    ray.tfar = inf;
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.primID = RTC_INVALID_GEOMETRY_ID;
    ray.mask = -1;
    ray.time() = time;
    weight = weight * c/wi.w;

#else

    /* continue with transparency ray */
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.tnear() = 1.001f*ray.tfar;
    ray.tfar = inf;
    weight *= brdf.Kt;

#endif

    depth++;
  }
  return color;
}